

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O2

Locale * icu_63::Collator::getAvailableLocales(int32_t *count)

{
  UBool UVar1;
  Locale *pLVar2;
  UErrorCode status;
  UErrorCode local_c;
  
  local_c = U_ZERO_ERROR;
  *count = 0;
  UVar1 = isAvailableLocaleListInitialized(&local_c);
  pLVar2 = ::availableLocaleList;
  if (UVar1 == '\0') {
    pLVar2 = (Locale *)0x0;
  }
  else {
    *count = ::availableLocaleListCount;
  }
  return pLVar2;
}

Assistant:

const Locale* U_EXPORT2 Collator::getAvailableLocales(int32_t& count) 
{
    UErrorCode status = U_ZERO_ERROR;
    Locale *result = NULL;
    count = 0;
    if (isAvailableLocaleListInitialized(status))
    {
        result = availableLocaleList;
        count = availableLocaleListCount;
    }
    return result;
}